

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

LoopShape * __thiscall CFG::Relooper::AddLoopShape(Relooper *this)

{
  int iVar1;
  LoopShape *local_30;
  _Head_base<0UL,_CFG::Shape_*,_false> local_28;
  
  std::make_unique<CFG::LoopShape>();
  iVar1 = this->ShapeIdCounter;
  this->ShapeIdCounter = iVar1 + 1;
  (local_30->super_Shape).Id = iVar1;
  local_28._M_head_impl = &local_30->super_Shape;
  std::
  deque<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>,std::allocator<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>>>
  ::emplace_back<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>>
            ((deque<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>,std::allocator<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>>>
              *)&this->Shapes,(unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_> *)&local_28)
  ;
  if ((LoopShape *)local_28._M_head_impl != (LoopShape *)0x0) {
    (*((Shape *)&(local_28._M_head_impl)->_vptr_Shape)->_vptr_Shape[1])();
  }
  return local_30;
}

Assistant:

LoopShape* Relooper::AddLoopShape() {
  auto shape = std::make_unique<LoopShape>();
  shape->Id = ShapeIdCounter++;
  auto* shapePtr = shape.get();
  Shapes.push_back(std::move(shape));
  return shapePtr;
}